

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O2

void __thiscall
TransitionObservationIndependentMADPDiscrete::GetOGet
          (TransitionObservationIndependentMADPDiscrete *this)

{
  GetOGet((TransitionObservationIndependentMADPDiscrete *)
          (&(this->super_MultiAgentDecisionProcess).field_0x0 +
          *(long *)(*(long *)&this->super_MultiAgentDecisionProcess + -0x140)));
  return;
}

Assistant:

OGet* GetOGet() const
        {
            if(!_m_jointModelsGenerated)
                return 0;

            if(_m_sparse)
                return new OGet_ObservationModelMappingSparse(
                    ((ObservationModelMappingSparse*)_m_p_oModel)  ); 
            else
                return new OGet_ObservationModelMapping(
                    ((ObservationModelMapping*)_m_p_oModel)  );
        }